

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScanner::OpenLumpNum(FScanner *this,int lump)

{
  FMemLump mem;
  undefined1 auStack_38 [16];
  
  this->ScriptOpen = false;
  FString::operator=(&this->ScriptBuffer,(char *)"");
  FString::operator=(&this->BigStringBuffer,(char *)"");
  this->StringBuffer[0] = '\0';
  this->String = this->StringBuffer;
  FWadCollection::ReadLump((FWadCollection *)auStack_38,0x1c70340);
  FString::AttachToOther((FString *)(auStack_38 + 8),(FString *)auStack_38);
  FString::operator=(&this->ScriptBuffer,(FString *)(auStack_38 + 8));
  FString::~FString((FString *)(auStack_38 + 8));
  FMemLump::~FMemLump((FMemLump *)auStack_38);
  FWadCollection::GetLumpFullPath((FWadCollection *)auStack_38,0x1c70340);
  FString::operator=(&this->ScriptName,(FString *)auStack_38);
  FString::~FString((FString *)auStack_38);
  this->LumpNum = lump;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner :: OpenLumpNum (int lump)
{
	Close ();
	{
		FMemLump mem = Wads.ReadLump(lump);
		ScriptBuffer = mem.GetString();
	}
	ScriptName = Wads.GetLumpFullPath(lump);
	LumpNum = lump;
	PrepareScript ();
}